

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall CNode::CloseSocketDisconnect(CNode *this)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  Logger *this_01;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  LOCK();
  (this->fDisconnect)._M_base._M_i = true;
  UNLOCK();
  criticalblock30.super_unique_lock._M_device = &(this->m_sock_mutex).super_mutex;
  criticalblock30.super_unique_lock._M_owns = false;
  std::unique_lock<std::mutex>::lock(&criticalblock30.super_unique_lock);
  if ((this->m_sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    this_01 = LogInstance();
    bVar2 = BCLog::Logger::WillLogCategoryLevel(this_01,NET,Debug);
    if (bVar2) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
      ;
      source_file._M_len = 0x57;
      logging_function._M_str = "CloseSocketDisconnect";
      logging_function._M_len = 0x15;
      LogPrintFormatInternal<long>
                (logging_function,source_file,0x22c,NET,Debug,(ConstevalFormatString<1U>)0xf7bbfd,
                 &this->id);
    }
    this_00 = (this->m_sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->m_sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
    ;
    (this->m_sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  std::__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::reset
            ((__uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
             &this->m_i2p_sam_session,(pointer)0x0);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock30.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CNode::CloseSocketDisconnect()
{
    fDisconnect = true;
    LOCK(m_sock_mutex);
    if (m_sock) {
        LogDebug(BCLog::NET, "disconnecting peer=%d\n", id);
        m_sock.reset();
    }
    m_i2p_sam_session.reset();
}